

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O0

void __thiscall
SDLInputJoystickManager::GetDevices
          (SDLInputJoystickManager *this,TArray<IJoystickConfig_*,_IJoystickConfig_*> *sticks)

{
  uint uVar1;
  TArray<IJoystickConfig_*,_IJoystickConfig_*> *this_00;
  uint uVar2;
  SDLInputJoystick **ppSVar3;
  SDLInputJoystick *local_28;
  uint local_1c;
  TArray<IJoystickConfig_*,_IJoystickConfig_*> *pTStack_18;
  uint i;
  TArray<IJoystickConfig_*,_IJoystickConfig_*> *sticks_local;
  SDLInputJoystickManager *this_local;
  
  local_1c = 0;
  pTStack_18 = sticks;
  sticks_local = (TArray<IJoystickConfig_*,_IJoystickConfig_*> *)this;
  while( true ) {
    uVar1 = local_1c;
    uVar2 = TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::Size(&this->Joysticks);
    if (uVar2 <= uVar1) break;
    ppSVar3 = TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::operator[]
                        (&this->Joysticks,(ulong)local_1c);
    M_LoadJoystickConfig(&(*ppSVar3)->super_IJoystickConfig);
    this_00 = pTStack_18;
    ppSVar3 = TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::operator[]
                        (&this->Joysticks,(ulong)local_1c);
    local_28 = *ppSVar3;
    TArray<IJoystickConfig_*,_IJoystickConfig_*>::Push(this_00,(IJoystickConfig **)&local_28);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void GetDevices(TArray<IJoystickConfig *> &sticks)
	{
		for(unsigned int i = 0;i < Joysticks.Size();i++)
		{
			M_LoadJoystickConfig(Joysticks[i]);
			sticks.Push(Joysticks[i]);
		}
	}